

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O0

void __thiscall
deqp::gls::RandomShaderProgram::shadeVertices
          (RandomShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int iVar1;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *pvVar2;
  size_type sVar3;
  const_reference ppSVar4;
  Variable *pVVar5;
  VariableType *pVVar6;
  float *pfVar7;
  const_reference ppVVar8;
  float fVar9;
  ConstStridedValueAccess<64> local_1c0;
  ConstStridedValueAccess<64> local_1b0;
  ConstStridedValueAccess<64> local_1a0;
  ConstStridedValueAccess<64> local_190;
  float *local_180;
  float *dst;
  VertexPacket *packet_2;
  int packetNdx_2;
  int ndx_2;
  Scalar *local_160;
  undefined1 local_158 [8];
  ExecConstValueAccess access_2;
  int numComponents_1;
  VariableType *varType;
  Variable *var;
  undefined1 auStack_128 [4];
  int varNdx;
  ConstStridedValueAccess<64> local_118;
  ConstStridedValueAccess<64> local_108;
  ConstStridedValueAccess<64> local_f8;
  VertexPacket *local_e8;
  VertexPacket *packet_1;
  int packetNdx_1;
  int ndx_1;
  Scalar *local_d0;
  undefined1 local_c8 [8];
  ExecConstValueAccess access_1;
  ConstStridedValueAccess<64> local_a8;
  ConstStridedValueAccess<64> local_98;
  ConstStridedValueAccess<64> local_88;
  undefined1 local_78 [8];
  Vec4 attribValue;
  VertexPacket *packet;
  int packetNdx;
  int ndx;
  ExecValueAccess access;
  int numComponents;
  VariableType *attribType;
  Variable *attribVar;
  int attribNdx;
  int numToExecute;
  int packetOffset;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  RandomShaderProgram *this_local;
  
  refreshUniforms(this);
  for (attribNdx = 0; attribNdx < numPackets; attribNdx = iVar1 + attribNdx) {
    iVar1 = de::min<int>(numPackets - attribNdx,0x40);
    attribVar._0_4_ = 0;
    while( true ) {
      pvVar2 = rsg::Shader::getInputs(this->m_vertexShader);
      sVar3 = std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::size(pvVar2);
      if ((int)sVar3 <= (int)attribVar) break;
      pvVar2 = rsg::Shader::getInputs(this->m_vertexShader);
      ppSVar4 = std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::operator[]
                          (pvVar2,(long)(int)attribVar);
      pVVar5 = rsg::ShaderInput::getVariable(*ppSVar4);
      pVVar6 = rsg::Variable::getType(pVVar5);
      access.super_ConstStridedValueAccess<64>.m_value._4_4_ =
           rsg::VariableType::getNumElements(pVVar6);
      _packetNdx = (ConstStridedValueAccess<64>)
                   rsg::ExecutionContext::getValue(&this->m_execCtx,pVVar5);
      for (packet._4_4_ = 0; packet._4_4_ < iVar1; packet._4_4_ = packet._4_4_ + 1) {
        attribValue.m_data._8_8_ = packets[packet._4_4_ + attribNdx];
        rr::readVertexAttribFloat
                  ((rr *)local_78,inputs + (int)attribVar,
                   ((VertexPacket *)attribValue.m_data._8_8_)->instanceNdx,
                   ((VertexPacket *)attribValue.m_data._8_8_)->vertexNdx);
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_78,0);
        fVar9 = *pfVar7;
        local_88 = (ConstStridedValueAccess<64>)
                   rsg::StridedValueAccess<64>::component((StridedValueAccess<64> *)&packetNdx,0);
        pfVar7 = rsg::StridedValueAccess<64>::asFloat
                           ((StridedValueAccess<64> *)&local_88,packet._4_4_);
        *pfVar7 = fVar9;
        if (1 < access.super_ConstStridedValueAccess<64>.m_value._4_4_) {
          pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_78,1);
          fVar9 = *pfVar7;
          local_98 = (ConstStridedValueAccess<64>)
                     rsg::StridedValueAccess<64>::component((StridedValueAccess<64> *)&packetNdx,1);
          pfVar7 = rsg::StridedValueAccess<64>::asFloat
                             ((StridedValueAccess<64> *)&local_98,packet._4_4_);
          *pfVar7 = fVar9;
        }
        if (2 < access.super_ConstStridedValueAccess<64>.m_value._4_4_) {
          pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_78,2);
          fVar9 = *pfVar7;
          local_a8 = (ConstStridedValueAccess<64>)
                     rsg::StridedValueAccess<64>::component((StridedValueAccess<64> *)&packetNdx,2);
          pfVar7 = rsg::StridedValueAccess<64>::asFloat
                             ((StridedValueAccess<64> *)&local_a8,packet._4_4_);
          *pfVar7 = fVar9;
        }
        if (3 < access.super_ConstStridedValueAccess<64>.m_value._4_4_) {
          pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_78,3);
          fVar9 = *pfVar7;
          join_0x00000010_0x00000000_ =
               (ConstStridedValueAccess<64>)
               rsg::StridedValueAccess<64>::component((StridedValueAccess<64> *)&packetNdx,3);
          pfVar7 = rsg::StridedValueAccess<64>::asFloat
                             ((StridedValueAccess<64> *)&access_1.m_value,packet._4_4_);
          *pfVar7 = fVar9;
        }
      }
      attribVar._0_4_ = (int)attribVar + 1;
    }
    rsg::Shader::execute(this->m_vertexShader,&this->m_execCtx);
    _packetNdx_1 = (ConstStridedValueAccess<64>)
                   rsg::ExecutionContext::getValue(&this->m_execCtx,this->m_positionVar);
    local_c8 = (undefined1  [8])_packetNdx_1;
    access_1.m_type = (VariableType *)local_d0;
    for (packet_1._4_4_ = 0; packet_1._4_4_ < iVar1; packet_1._4_4_ = packet_1._4_4_ + 1) {
      packet_1._0_4_ = packet_1._4_4_ + attribNdx;
      local_e8 = packets[(int)packet_1];
      local_f8 = rsg::ConstStridedValueAccess<64>::component
                           ((ConstStridedValueAccess<64> *)local_c8,0);
      fVar9 = rsg::ConstStridedValueAccess<64>::asFloat(&local_f8,packet_1._4_4_);
      pfVar7 = tcu::Vector<float,_4>::operator[](&local_e8->position,0);
      *pfVar7 = fVar9;
      local_108 = rsg::ConstStridedValueAccess<64>::component
                            ((ConstStridedValueAccess<64> *)local_c8,1);
      fVar9 = rsg::ConstStridedValueAccess<64>::asFloat(&local_108,packet_1._4_4_);
      pfVar7 = tcu::Vector<float,_4>::operator[](&local_e8->position,1);
      *pfVar7 = fVar9;
      local_118 = rsg::ConstStridedValueAccess<64>::component
                            ((ConstStridedValueAccess<64> *)local_c8,2);
      fVar9 = rsg::ConstStridedValueAccess<64>::asFloat(&local_118,packet_1._4_4_);
      pfVar7 = tcu::Vector<float,_4>::operator[](&local_e8->position,2);
      *pfVar7 = fVar9;
      _auStack_128 = rsg::ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)local_c8,3);
      fVar9 = rsg::ConstStridedValueAccess<64>::asFloat
                        ((ConstStridedValueAccess<64> *)auStack_128,packet_1._4_4_);
      pfVar7 = tcu::Vector<float,_4>::operator[](&local_e8->position,3);
      *pfVar7 = fVar9;
    }
    var._4_4_ = 0;
    while( true ) {
      sVar3 = std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::size
                        (&this->m_vertexOutputs);
      if ((int)sVar3 <= var._4_4_) break;
      ppVVar8 = std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::
                operator[](&this->m_vertexOutputs,(long)var._4_4_);
      pVVar5 = *ppVVar8;
      pVVar6 = rsg::Variable::getType(pVVar5);
      access_2.m_value._4_4_ = rsg::VariableType::getNumElements(pVVar6);
      _packetNdx_2 = (ConstStridedValueAccess<64>)
                     rsg::ExecutionContext::getValue(&this->m_execCtx,pVVar5);
      local_158 = (undefined1  [8])_packetNdx_2;
      access_2.m_type = (VariableType *)local_160;
      for (packet_2._4_4_ = 0; packet_2._4_4_ < iVar1; packet_2._4_4_ = packet_2._4_4_ + 1) {
        packet_2._0_4_ = packet_2._4_4_ + attribNdx;
        dst = (float *)packets[(int)packet_2];
        local_180 = rr::GenericVec4::getAccess<float>(((VertexPacket *)dst)->outputs + var._4_4_);
        local_190 = rsg::ConstStridedValueAccess<64>::component
                              ((ConstStridedValueAccess<64> *)local_158,0);
        fVar9 = rsg::ConstStridedValueAccess<64>::asFloat(&local_190,packet_2._4_4_);
        *local_180 = fVar9;
        if (1 < access_2.m_value._4_4_) {
          local_1a0 = rsg::ConstStridedValueAccess<64>::component
                                ((ConstStridedValueAccess<64> *)local_158,1);
          fVar9 = rsg::ConstStridedValueAccess<64>::asFloat(&local_1a0,packet_2._4_4_);
          local_180[1] = fVar9;
        }
        if (2 < access_2.m_value._4_4_) {
          local_1b0 = rsg::ConstStridedValueAccess<64>::component
                                ((ConstStridedValueAccess<64> *)local_158,2);
          fVar9 = rsg::ConstStridedValueAccess<64>::asFloat(&local_1b0,packet_2._4_4_);
          local_180[2] = fVar9;
        }
        if (3 < access_2.m_value._4_4_) {
          local_1c0 = rsg::ConstStridedValueAccess<64>::component
                                ((ConstStridedValueAccess<64> *)local_158,3);
          fVar9 = rsg::ConstStridedValueAccess<64>::asFloat(&local_1c0,packet_2._4_4_);
          local_180[3] = fVar9;
        }
      }
      var._4_4_ = var._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void RandomShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	// \todo [2013-12-13 pyry] Do only when necessary.
	refreshUniforms();

	int packetOffset = 0;

	while (packetOffset < numPackets)
	{
		const int	numToExecute	= de::min(numPackets-packetOffset, (int)rsg::EXEC_VEC_WIDTH);

		// Fetch attributes.
		for (int attribNdx = 0; attribNdx < (int)m_vertexShader.getInputs().size(); ++attribNdx)
		{
			const rsg::Variable*		attribVar		= m_vertexShader.getInputs()[attribNdx]->getVariable();
			const rsg::VariableType&	attribType		= attribVar->getType();
			const int					numComponents	= attribType.getNumElements();
			rsg::ExecValueAccess		access			= m_execCtx.getValue(attribVar);

			DE_ASSERT(attribType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int				packetNdx	= ndx+packetOffset;
				const rr::VertexPacket*	packet		= packets[packetNdx];
				const tcu::Vec4			attribValue	= rr::readVertexAttribFloat(inputs[attribNdx], packet->instanceNdx, packet->vertexNdx);

										access.component(0).asFloat(ndx) = attribValue[0];
				if (numComponents >= 2)	access.component(1).asFloat(ndx) = attribValue[1];
				if (numComponents >= 3)	access.component(2).asFloat(ndx) = attribValue[2];
				if (numComponents >= 4)	access.component(3).asFloat(ndx) = attribValue[3];
			}
		}

		m_vertexShader.execute(m_execCtx);

		// Store position
		{
			const rsg::ExecConstValueAccess	access	= m_execCtx.getValue(m_positionVar);

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int			packetNdx	= ndx+packetOffset;
				rr::VertexPacket*	packet		= packets[packetNdx];

				packet->position[0] = access.component(0).asFloat(ndx);
				packet->position[1] = access.component(1).asFloat(ndx);
				packet->position[2] = access.component(2).asFloat(ndx);
				packet->position[3] = access.component(3).asFloat(ndx);
			}
		}

		// Other varyings
		for (int varNdx = 0; varNdx < (int)m_vertexOutputs.size(); varNdx++)
		{
			const rsg::Variable*			var				= m_vertexOutputs[varNdx];
			const rsg::VariableType&		varType			= var->getType();
			const int						numComponents	= varType.getNumElements();
			const rsg::ExecConstValueAccess	access			= m_execCtx.getValue(var);

			DE_ASSERT(varType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int ndx = 0; ndx < numToExecute; ndx++)
			{
				const int				packetNdx	= ndx+packetOffset;
				rr::VertexPacket* const	packet		= packets[packetNdx];
				float* const			dst			= packet->outputs[varNdx].getAccess<float>();

										dst[0] = access.component(0).asFloat(ndx);
				if (numComponents >= 2) dst[1] = access.component(1).asFloat(ndx);
				if (numComponents >= 3) dst[2] = access.component(2).asFloat(ndx);
				if (numComponents >= 4) dst[3] = access.component(3).asFloat(ndx);
			}
		}

		packetOffset += numToExecute;
	}
}